

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O0

time_t Convert(time_t Month,time_t Day,time_t Year,time_t Hours,time_t Minutes,time_t Seconds,
              time_t Timezone,DSTMODE DSTmode)

{
  tm *ptVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  int i;
  time_t Julian;
  bool local_46;
  int local_44;
  long local_40 [4];
  long local_20;
  long local_10;
  long local_8;
  
  if (in_RDX < 0x45) {
    local_20 = in_RDX + 2000;
  }
  else {
    local_20 = in_RDX;
    if (in_RDX < 100) {
      local_20 = in_RDX + 0x76c;
    }
  }
  local_46 = false;
  if (local_20 % 4 == 0) {
    local_46 = local_20 % 100 != 0 || local_20 % 400 == 0;
  }
  Convert::DaysInMonth[1] = 0x1c;
  if (local_46) {
    Convert::DaysInMonth[1] = 0x1d;
  }
  if (((((local_20 < 0x7b2) || (0x7f6 < local_20)) || (in_RDI < 1)) ||
      ((((0xc < in_RDI || (in_RSI < 1)) ||
        ((local_10 = in_RDI + -1, Convert::DaysInMonth[(int)local_10] < in_RSI ||
         ((in_RCX < 0 || (0x17 < in_RCX)))))) || (in_R8 < 0)))) ||
     (((0x3b < in_R8 || (in_R9 < 0)) || (0x3b < in_R9)))) {
    local_8 = -1;
  }
  else {
    local_40[0] = in_RSI + -1;
    for (local_44 = 0; local_44 < local_10; local_44 = local_44 + 1) {
      local_40[0] = Convert::DaysInMonth[local_44] + local_40[0];
    }
    for (local_44 = 0x7b2; local_44 < local_20; local_44 = local_44 + 1) {
      local_40[0] = (int)((local_44 % 4 == 0) + 0x16d) + local_40[0];
    }
    local_40[0] = in_RCX * 0xe10 + in_R8 * 0x3c + in_R9 + Julian + local_40[0] * 0x15180;
    if (((int)Seconds == 0) ||
       (((int)Seconds == 2 && (ptVar1 = localtime(local_40), ptVar1->tm_isdst != 0)))) {
      local_40[0] = local_40[0] + -0xe10;
    }
    local_8 = local_40[0];
  }
  return local_8;
}

Assistant:

static time_t
Convert(time_t Month, time_t Day, time_t Year,
	time_t Hours, time_t Minutes, time_t Seconds,
	time_t Timezone, enum DSTMODE DSTmode)
{
	static int DaysInMonth[12] = {
		31, 0, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31
	};
	time_t	Julian;
	int	i;

	if (Year < 69)
		Year += 2000;
	else if (Year < 100)
		Year += 1900;
	DaysInMonth[1] = Year % 4 == 0 && (Year % 100 != 0 || Year % 400 == 0)
	    ? 29 : 28;
	/* Checking for 2038 bogusly assumes that time_t is 32 bits.  But
	   I'm too lazy to try to check for time_t overflow in another way.  */
	if (Year < EPOCH || Year > 2038
	    || Month < 1 || Month > 12
	    /* Lint fluff:  "conversion from long may lose accuracy" */
	    || Day < 1 || Day > DaysInMonth[(int)--Month]
	    || Hours < 0 || Hours > 23
	    || Minutes < 0 || Minutes > 59
	    || Seconds < 0 || Seconds > 59)
		return -1;

	Julian = Day - 1;
	for (i = 0; i < Month; i++)
		Julian += DaysInMonth[i];
	for (i = EPOCH; i < Year; i++)
		Julian += 365 + (i % 4 == 0);
	Julian *= DAY;
	Julian += Timezone;
	Julian += Hours * HOUR + Minutes * MINUTE + Seconds;
	if (DSTmode == DSTon
	    || (DSTmode == DSTmaybe && localtime(&Julian)->tm_isdst))
		Julian -= HOUR;
	return Julian;
}